

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::mark_location_as_used_by_shader
          (CompilerMSL *this,uint32_t location,SPIRType *type,StorageClass storage)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t j;
  uint uVar3;
  uint32_t i;
  int iVar4;
  ulong uVar5;
  int iVar6;
  value_type local_44;
  int local_40;
  uint32_t local_3c;
  CompilerMSL *local_38;
  
  if (storage == StorageClassInput) {
    local_3c = location;
    local_38 = this;
    bVar1 = Compiler::is_array((Compiler *)this,type);
    if (bVar1) {
      iVar6 = 1;
      uVar5 = 0;
      while( true ) {
        if ((type->array).super_VectorView<unsigned_int>.buffer_size <= uVar5) break;
        uVar2 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type,(uint32_t)uVar5);
        iVar6 = iVar6 * uVar2;
        uVar5 = (ulong)((uint32_t)uVar5 + 1);
      }
      local_40 = iVar6;
      for (iVar4 = 0; iVar4 != local_40; iVar4 = iVar4 + 1) {
        bVar1 = Compiler::is_matrix((Compiler *)local_38,type);
        if (bVar1) {
          uVar3 = 0;
          while( true ) {
            uVar2 = location + uVar3;
            if (type->columns <= uVar3) break;
            local_44 = uVar2;
            ::std::__detail::
            _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&this->inputs_in_use,&local_44);
            uVar3 = uVar3 + 1;
          }
        }
        else {
          uVar2 = location + 1;
          local_44 = location;
          ::std::__detail::
          _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)&this->inputs_in_use,&local_44);
        }
        location = uVar2;
      }
    }
    else {
      bVar1 = Compiler::is_matrix((Compiler *)this,type);
      if (bVar1) {
        for (uVar3 = 0; uVar3 < type->columns; uVar3 = uVar3 + 1) {
          local_44 = location + uVar3;
          ::std::__detail::
          _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)&this->inputs_in_use,&local_44);
        }
      }
      else {
        ::std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&this->inputs_in_use,&local_3c);
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::mark_location_as_used_by_shader(uint32_t location, const SPIRType &type, StorageClass storage)
{
	if (storage != StorageClassInput)
		return;
	if (is_array(type))
	{
		uint32_t dim = 1;
		for (uint32_t i = 0; i < type.array.size(); i++)
			dim *= to_array_size_literal(type, i);
		for (uint32_t i = 0; i < dim; i++)
		{
			if (is_matrix(type))
			{
				for (uint32_t j = 0; j < type.columns; j++)
					inputs_in_use.insert(location++);
			}
			else
				inputs_in_use.insert(location++);
		}
	}
	else if (is_matrix(type))
	{
		for (uint32_t i = 0; i < type.columns; i++)
			inputs_in_use.insert(location + i);
	}
	else
		inputs_in_use.insert(location);
}